

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O0

void dradb3(int ido,int l1,float *cc,float *ch,float *wa1,float *wa2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float tr2;
  float ti2;
  float dr3;
  float dr2;
  float cr3;
  float cr2;
  float di3;
  float di2;
  float ci3;
  float ci2;
  int t10;
  int t9;
  int t8;
  int t7;
  int t6;
  int t5;
  int t4;
  int t3;
  int t2;
  int t1;
  int t0;
  int k;
  int i;
  float *wa2_local;
  float *wa1_local;
  float *ch_local;
  float *cc_local;
  int l1_local;
  int ido_local;
  
  iVar1 = l1 * ido;
  t3 = 0;
  t5 = ido << 1;
  t7 = 0;
  for (t1 = 0; t1 < l1; t1 = t1 + 1) {
    fVar5 = dradb3::taur * (cc[t5 + -1] + cc[t5 + -1]) + cc[t7];
    ch[t3] = cc[t7] + cc[t5 + -1] + cc[t5 + -1];
    fVar6 = dradb3::taui * (cc[t5] + cc[t5]);
    ch[t3 + iVar1] = fVar5 - fVar6;
    ch[t3 + iVar1 * 2] = fVar5 + fVar6;
    t3 = ido + t3;
    t5 = ido * 3 + t5;
    t7 = ido * 3 + t7;
  }
  if (ido != 1) {
    t3 = 0;
    for (t1 = 0; t1 < l1; t1 = t1 + 1) {
      t8 = t3 * 3 + ido * 2;
      t10 = t3;
      ci3 = (float)(t3 + iVar1 + iVar1);
      ci2 = (float)(t3 + iVar1);
      t9 = t3 * 3;
      t7 = t8;
      for (t0 = 2; t0 < ido; t0 = t0 + 2) {
        iVar2 = t7 + 2;
        iVar3 = t8 + -2;
        iVar4 = t9 + 2;
        fVar7 = dradb3::taur * (cc[t7 + 1] + cc[t8 + -3]) + cc[t9 + 1];
        ch[t10 + 1] = cc[t9 + 1] + cc[t7 + 1] + cc[t8 + -3];
        fVar8 = dradb3::taur * (cc[iVar2] - cc[iVar3]) + cc[iVar4];
        ch[t10 + 2] = cc[iVar4] + (cc[iVar2] - cc[iVar3]);
        fVar5 = dradb3::taui * (cc[t7 + 1] - cc[t8 + -3]);
        fVar6 = dradb3::taui * (cc[iVar2] + cc[iVar3]);
        fVar9 = fVar7 - fVar6;
        fVar7 = fVar7 + fVar6;
        fVar6 = fVar8 + fVar5;
        fVar8 = fVar8 - fVar5;
        ch[(int)ci2 + 1] = wa1[t0 + -2] * fVar9 + -(wa1[t0 + -1] * fVar6);
        ch[(int)ci2 + 2] = wa1[t0 + -2] * fVar6 + wa1[t0 + -1] * fVar9;
        ch[(int)ci3 + 1] = wa2[t0 + -2] * fVar7 + -(wa2[t0 + -1] * fVar8);
        ch[(int)ci3 + 2] = wa2[t0 + -2] * fVar8 + wa2[t0 + -1] * fVar7;
        ci3 = (float)((int)ci3 + 2);
        ci2 = (float)((int)ci2 + 2);
        t10 = t10 + 2;
        t9 = iVar4;
        t8 = iVar3;
        t7 = iVar2;
      }
      t3 = ido + t3;
    }
  }
  return;
}

Assistant:

static void dradb3(int ido,int l1,float *cc,float *ch,float *wa1,
                          float *wa2){
  static float taur = -.5f;
  static float taui = .8660254037844386f;
  int i,k,t0,t1,t2,t3,t4,t5,t6,t7,t8,t9,t10;
  float ci2,ci3,di2,di3,cr2,cr3,dr2,dr3,ti2,tr2;
  t0=l1*ido;

  t1=0;
  t2=t0<<1;
  t3=ido<<1;
  t4=ido+(ido<<1);
  t5=0;
  for(k=0;k<l1;k++){
    tr2=cc[t3-1]+cc[t3-1];
    cr2=cc[t5]+(taur*tr2);
    ch[t1]=cc[t5]+tr2;
    ci3=taui*(cc[t3]+cc[t3]);
    ch[t1+t0]=cr2-ci3;
    ch[t1+t2]=cr2+ci3;
    t1+=ido;
    t3+=t4;
    t5+=t4;
  }

  if(ido==1)return;

  t1=0;
  t3=ido<<1;
  for(k=0;k<l1;k++){
    t7=t1+(t1<<1);
    t6=(t5=t7+t3);
    t8=t1;
    t10=(t9=t1+t0)+t0;

    for(i=2;i<ido;i+=2){
      t5+=2;
      t6-=2;
      t7+=2;
      t8+=2;
      t9+=2;
      t10+=2;
      tr2=cc[t5-1]+cc[t6-1];
      cr2=cc[t7-1]+(taur*tr2);
      ch[t8-1]=cc[t7-1]+tr2;
      ti2=cc[t5]-cc[t6];
      ci2=cc[t7]+(taur*ti2);
      ch[t8]=cc[t7]+ti2;
      cr3=taui*(cc[t5-1]-cc[t6-1]);
      ci3=taui*(cc[t5]+cc[t6]);
      dr2=cr2-ci3;
      dr3=cr2+ci3;
      di2=ci2+cr3;
      di3=ci2-cr3;
      ch[t9-1]=wa1[i-2]*dr2-wa1[i-1]*di2;
      ch[t9]=wa1[i-2]*di2+wa1[i-1]*dr2;
      ch[t10-1]=wa2[i-2]*dr3-wa2[i-1]*di3;
      ch[t10]=wa2[i-2]*di3+wa2[i-1]*dr3;
    }
    t1+=ido;
  }
}